

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall
ConnmanTestMsg::Handshake
          (ConnmanTestMsg *this,CNode *node,bool successfully_connected,ServiceFlags remote_services
          ,ServiceFlags param_4,int32_t version,bool relay_txs)

{
  CChainParams **ppCVar1;
  atomic<bool> *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  ConnmanTestMsg *pCVar5;
  NetEventsInterface *pNVar6;
  string msg_type;
  int iVar7;
  undefined4 uVar8;
  undefined7 in_register_00000011;
  ConnmanTestMsg *pCVar9;
  long in_FS_OFFSET;
  unsigned_long *args_7;
  undefined4 in_stack_fffffffffffffe18;
  char cVar10;
  uint in_stack_fffffffffffffe28;
  undefined8 local_1d0;
  SerParams *local_1c8;
  CSerializedNetMsg *local_1c0;
  undefined8 local_1b8;
  SerParams *local_1b0;
  CNodeStateStats *local_1a8;
  long local_1a0 [2];
  Wrapper<CustomUintFormatter<8,_false>,_ServiceFlags_&> local_190;
  bool relay_txs_local;
  int32_t version_local;
  ServiceFlags remote_services_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  CSerializedNetMsg msg_verack;
  CNodeStateStats statestats;
  ParamsWrapper<CNetAddr::SerParams,_CService> local_b0;
  undefined8 local_a0;
  long *local_90 [2];
  long local_80 [2];
  CSerializedNetMsg msg_version;
  
  uVar8 = (undefined4)CONCAT71(in_register_00000011,successfully_connected);
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  relay_txs_local = relay_txs;
  pCVar5 = (ConnmanTestMsg *)(this->super_CConnman).m_msgproc;
  version_local = version;
  remote_services_local = remote_services;
  (***(_func_int ***)
      &(pCVar5->super_CConnman).m_total_bytes_sent_mutex.super_mutex.super___mutex_base._M_mutex)
            (pCVar5,node,param_4);
  pCVar9 = pCVar5;
  (*((_func_int **)
    (pCVar5->super_CConnman).m_total_bytes_sent_mutex.super_mutex.super___mutex_base._M_mutex.
    __align)[4])(pCVar5,node);
  FlushSendBuffer(pCVar9,node);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"version","");
  local_1a0[1] = 0;
  local_1a0[0] = 0;
  local_190.m_object = &remote_services_local;
  CService::CService((CService *)&statestats);
  local_1b0 = &CNetAddr::V1;
  local_1b8 = 0;
  args_7 = (unsigned_long *)0x832392;
  local_1a8 = &statestats;
  CService::CService((CService *)&msg_verack);
  local_1c8 = &CNetAddr::V1;
  local_1d0 = 1;
  local_b0.m_object = (CService *)0x0;
  local_a0._0_1_ = 0;
  msg_type._M_string_length = (size_type)&local_1b8;
  msg_type._M_dataplus._M_p = (pointer)&local_1b0;
  msg_type.field_2._M_allocated_capacity = (size_type)&local_1c8;
  msg_type.field_2._8_8_ = &local_1d0;
  local_1c0 = &msg_verack;
  local_b0.m_params = (SerParams *)&local_a0;
  NetMsg::
  Make<int&,Wrapper<CustomUintFormatter<8,false>,ServiceFlags&>,long,long,ParamsWrapper<CNetAddr::SerParams,CService>,long,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long,std::__cxx11::string,int,bool&>
            (&msg_version,(NetMsg *)local_90,msg_type,&version_local,&local_190,local_1a0 + 1,
             local_1a0,&local_b0,(long *)&stack0xfffffffffffffe2c,
             (ParamsWrapper<CNetAddr::SerParams,_CService> *)&relay_txs_local,args_7,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar8,in_stack_fffffffffffffe18),(int *)this,
             (bool *)(ulong)in_stack_fffffffffffffe28);
  cVar10 = (char)uVar8;
  if (local_b0.m_params != (SerParams *)&local_a0) {
    operator_delete(local_b0.m_params,CONCAT71(local_a0._1_7_,(undefined1)local_a0) + 1);
  }
  if (0x10 < (uint)msg_verack.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    free(msg_verack.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start);
  }
  if (0x10 < (uint)statestats.m_ping_wait.__r) {
    free((void *)statestats._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  ReceiveMsgFrom(this,node,&msg_version);
  LOCK();
  (node->fPauseSend)._M_base._M_i = false;
  UNLOCK();
  pNVar6 = (this->super_CConnman).m_msgproc;
  paVar2 = &(this->super_CConnman).flagInterruptMsgProc;
  (*pNVar6->_vptr_NetEventsInterface[3])(pNVar6,node,paVar2);
  pCVar9 = pCVar5;
  (*((_func_int **)
    (pCVar5->super_CConnman).m_total_bytes_sent_mutex.super_mutex.super___mutex_base._M_mutex.
    __align)[4])(pCVar5,node);
  FlushSendBuffer(pCVar9,node);
  if (((node->fDisconnect)._M_base._M_i & 1U) == 0) {
    if ((node->nVersion).super___atomic_base<int>._M_i != version_local) {
      __assert_fail("node.nVersion == version",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/net.cpp"
                    ,0x37,
                    "void ConnmanTestMsg::Handshake(CNode &, bool, ServiceFlags, ServiceFlags, int32_t, bool)"
                   );
    }
    iVar7 = 0x11180;
    if (version_local < 0x11180) {
      iVar7 = version_local;
    }
    if ((node->m_greatest_common_version).super___atomic_base<int>._M_i != iVar7) {
      __assert_fail("node.GetCommonVersion() == std::min(version, PROTOCOL_VERSION)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/net.cpp"
                    ,0x38,
                    "void ConnmanTestMsg::Handshake(CNode &, bool, ServiceFlags, ServiceFlags, int32_t, bool)"
                   );
    }
    ppCVar1 = &pCVar5[-1].super_CConnman.m_params;
    statestats.nSyncHeight = -1;
    statestats.nCommonHeight = -1;
    statestats.m_starting_height = -1;
    statestats.vHeightInFlight.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    statestats.vHeightInFlight.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    statestats.vHeightInFlight.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    statestats.m_addr_processed = 0;
    statestats.m_addr_rate_limited = 0;
    statestats.m_addr_relay_enabled = false;
    statestats.presync_height = -1;
    statestats.time_offset.__r = 0;
    iVar7 = (**(code **)(((*ppCVar1)->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems +
                        0x14))(ppCVar1,node->id);
    if ((char)iVar7 == '\0') {
      __assert_fail("peerman.GetNodeStateStats(node.GetId(), statestats)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/net.cpp"
                    ,0x3a,
                    "void ConnmanTestMsg::Handshake(CNode &, bool, ServiceFlags, ServiceFlags, int32_t, bool)"
                   );
    }
    if (statestats.m_relay_txs != (bool)(node->m_conn_type != BLOCK_RELAY & relay_txs_local)) {
      __assert_fail("statestats.m_relay_txs == (relay_txs && !node.IsBlockOnlyConn())",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/net.cpp"
                    ,0x3b,
                    "void ConnmanTestMsg::Handshake(CNode &, bool, ServiceFlags, ServiceFlags, int32_t, bool)"
                   );
    }
    if (statestats.their_services != remote_services_local) {
      __assert_fail("statestats.their_services == remote_services",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/net.cpp"
                    ,0x3c,
                    "void ConnmanTestMsg::Handshake(CNode &, bool, ServiceFlags, ServiceFlags, int32_t, bool)"
                   );
    }
    if (cVar10 != '\0') {
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"verack","");
      msg_verack.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      msg_verack.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      msg_verack.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paVar3 = &msg_verack.m_type.field_2;
      msg_verack.m_type._M_string_length = 0;
      msg_verack.m_type.field_2._M_local_buf[0] = '\0';
      msg_verack.m_type._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&msg_verack.m_type,&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      ReceiveMsgFrom(this,node,&msg_verack);
      LOCK();
      (node->fPauseSend)._M_base._M_i = false;
      UNLOCK();
      pNVar6 = (this->super_CConnman).m_msgproc;
      (*pNVar6->_vptr_NetEventsInterface[3])(pNVar6,node,paVar2);
      (*((_func_int **)
        (pCVar5->super_CConnman).m_total_bytes_sent_mutex.super_mutex.super___mutex_base._M_mutex.
        __align)[4])(pCVar5,node);
      if (((node->fSuccessfullyConnected)._M_base._M_i & 1U) == 0) {
        __assert_fail("node.fSuccessfullyConnected == true",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/net.cpp"
                      ,0x43,
                      "void ConnmanTestMsg::Handshake(CNode &, bool, ServiceFlags, ServiceFlags, int32_t, bool)"
                     );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg_verack.m_type._M_dataplus._M_p != paVar3) {
        operator_delete(msg_verack.m_type._M_dataplus._M_p,
                        CONCAT71(msg_verack.m_type.field_2._M_allocated_capacity._1_7_,
                                 msg_verack.m_type.field_2._M_local_buf[0]) + 1);
      }
      if (msg_verack.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(msg_verack.data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)msg_verack.data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)msg_verack.data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (statestats.vHeightInFlight.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(statestats.vHeightInFlight.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)statestats.vHeightInFlight.super__Vector_base<int,_std::allocator<int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)statestats.vHeightInFlight.super__Vector_base<int,_std::allocator<int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msg_version.m_type._M_dataplus._M_p != &msg_version.m_type.field_2) {
    operator_delete(msg_version.m_type._M_dataplus._M_p,
                    msg_version.m_type.field_2._M_allocated_capacity + 1);
  }
  if (msg_version.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(msg_version.data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)msg_version.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)msg_version.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ConnmanTestMsg::Handshake(CNode& node,
                               bool successfully_connected,
                               ServiceFlags remote_services,
                               ServiceFlags local_services,
                               int32_t version,
                               bool relay_txs)
{
    auto& peerman{static_cast<PeerManager&>(*m_msgproc)};
    auto& connman{*this};

    peerman.InitializeNode(node, local_services);
    peerman.SendMessages(&node);
    FlushSendBuffer(node); // Drop the version message added by SendMessages.

    CSerializedNetMsg msg_version{
        NetMsg::Make(NetMsgType::VERSION,
                version,                                        //
                Using<CustomUintFormatter<8>>(remote_services), //
                int64_t{},                                      // dummy time
                int64_t{},                                      // ignored service bits
                CNetAddr::V1(CService{}),                       // dummy
                int64_t{},                                      // ignored service bits
                CNetAddr::V1(CService{}),                       // ignored
                uint64_t{1},                                    // dummy nonce
                std::string{},                                  // dummy subver
                int32_t{},                                      // dummy starting_height
                relay_txs),
    };

    (void)connman.ReceiveMsgFrom(node, std::move(msg_version));
    node.fPauseSend = false;
    connman.ProcessMessagesOnce(node);
    peerman.SendMessages(&node);
    FlushSendBuffer(node); // Drop the verack message added by SendMessages.
    if (node.fDisconnect) return;
    assert(node.nVersion == version);
    assert(node.GetCommonVersion() == std::min(version, PROTOCOL_VERSION));
    CNodeStateStats statestats;
    assert(peerman.GetNodeStateStats(node.GetId(), statestats));
    assert(statestats.m_relay_txs == (relay_txs && !node.IsBlockOnlyConn()));
    assert(statestats.their_services == remote_services);
    if (successfully_connected) {
        CSerializedNetMsg msg_verack{NetMsg::Make(NetMsgType::VERACK)};
        (void)connman.ReceiveMsgFrom(node, std::move(msg_verack));
        node.fPauseSend = false;
        connman.ProcessMessagesOnce(node);
        peerman.SendMessages(&node);
        assert(node.fSuccessfullyConnected == true);
    }
}